

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateCopyObject(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  DiagnosticStream *pDVar2;
  DiagnosticStream local_3d8;
  DiagnosticStream local_200;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t operand_type;
  uint32_t result_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _operand_type = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::type_id(inst);
  local_28 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_operand_type,2);
  if (local_28 == local_24) {
    bVar1 = ValidationState_t::IsVoidType((ValidationState_t *)inst_local,local_24);
    if (bVar1) {
      ValidationState_t::diag
                (&local_3d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_operand_type);
      pDVar2 = DiagnosticStream::operator<<
                         (&local_3d8,(char (*) [42])"OpCopyObject cannot have void result type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      DiagnosticStream::~DiagnosticStream(&local_3d8);
    }
    else {
      __local._4_4_ = SPV_SUCCESS;
    }
  }
  else {
    ValidationState_t::diag
              (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_operand_type);
    pDVar2 = DiagnosticStream::operator<<
                       (&local_200,
                        (char (*) [53])"Expected Result Type and Operand type to be the same");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    DiagnosticStream::~DiagnosticStream(&local_200);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateCopyObject(ValidationState_t& _, const Instruction* inst) {
  const uint32_t result_type = inst->type_id();
  const uint32_t operand_type = _.GetOperandTypeId(inst, 2);
  if (operand_type != result_type) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Result Type and Operand type to be the same";
  }
  if (_.IsVoidType(result_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "OpCopyObject cannot have void result type";
  }
  return SPV_SUCCESS;
}